

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Ps(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  Gps_Par_t *pPars;
  Gia_Man_t *p;
  Gps_Par_t Pars;
  Gps_Par_t local_68;
  Abc_Frame_t *local_38;
  
  local_68.fSlacks = 0;
  local_68.fNoColor = 0;
  local_68.pDumpFile = (char *)0x0;
  local_68.fLutProf = 0;
  local_68.fMuxXor = 0;
  local_68.fMiter = 0;
  local_68.fSkipMap = 0;
  local_68.fTents = 0;
  local_68.fSwitch = 0;
  local_68.fCut = 0;
  local_68.fNpn = 0;
  bVar1 = false;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Dtpcnlmaszxbh");
    switch(iVar2) {
    case 0x61:
      local_68._24_8_ = local_68._24_8_ ^ 1;
      break;
    case 0x62:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 99:
      local_68._8_8_ = local_68._8_8_ ^ 1;
      break;
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6f:
    case 0x71:
    case 0x72:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x79:
switchD_00277bc4_caseD_64:
      Abc_Print(-2,"usage: &ps [-tpcnlmaszxbh] [-D file]\n");
      Abc_Print(-2,"\t          prints stats of the current AIG\n");
      pcVar4 = "yes";
      pcVar3 = "yes";
      if (local_68.fTents == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-t      : toggle printing BMC tents [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fSwitch == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-p      : toggle printing switching activity [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fCut == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-c      : toggle printing the size of frontier cut [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fNpn == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-n      : toggle printing NPN classes of functions [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fLutProf == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-l      : toggle printing LUT size profile [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fMuxXor == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-m      : toggle printing MUX/XOR statistics [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fMiter == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-a      : toggle printing miter statistics [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fSlacks == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-s      : toggle printing slack distribution [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fSkipMap == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-z      : skip mapping statistics even if mapped [default = %s]\n",pcVar3);
      pcVar3 = "yes";
      if (local_68.fNoColor == 0) {
        pcVar3 = "no";
      }
      Abc_Print(-2,"\t-n      : toggle using no color in the printout [default = %s]\n",pcVar3);
      if (!bVar1) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-x      : toggle printing saved AIG statistics [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-D file : file name to dump statistics [default = none]\n");
      pcVar3 = "\t-h      : print the command usage\n";
      iVar2 = -2;
LAB_00277e09:
      Abc_Print(iVar2,pcVar3);
      return 1;
    case 0x6c:
      local_68._16_8_ = local_68._16_8_ ^ 1;
      break;
    case 0x6d:
      local_68._16_8_ = local_68._16_8_ ^ 0x100000000;
      break;
    case 0x6e:
      local_68._8_8_ = local_68._8_8_ ^ 0x100000000;
      break;
    case 0x70:
      local_68._0_8_ = local_68._0_8_ ^ 0x100000000;
      break;
    case 0x73:
      local_68._32_8_ = local_68._32_8_ ^ 1;
      break;
    case 0x74:
      local_68._0_8_ = local_68._0_8_ ^ 1;
      break;
    case 0x78:
      local_68._32_8_ = local_68._32_8_ ^ 0x100000000;
      break;
    case 0x7a:
      local_68._24_8_ = local_68._24_8_ ^ 0x100000000;
      break;
    default:
      if (iVar2 != 0x44) {
        if (iVar2 == -1) {
          if (bVar1) {
            p = local_38->pGiaBest;
          }
          else {
            p = local_38->pGia;
          }
          if (p != (Gia_Man_t *)0x0) {
            Gia_ManPrintStats(p,&local_68);
            return 0;
          }
          pcVar3 = "Abc_CommandAbc9Ps(): There is no AIG.\n";
          iVar2 = -1;
          goto LAB_00277e09;
        }
        goto switchD_00277bc4_caseD_64;
      }
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a file name.\n");
        goto switchD_00277bc4_caseD_64;
      }
      local_68.pDumpFile = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Ps( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gps_Par_t Pars, * pPars = &Pars;
    int c, fBest = 0;
    memset( pPars, 0, sizeof(Gps_Par_t) );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Dtpcnlmaszxbh" ) ) != EOF )
    {
        switch ( c )
        {
        case 't':
            pPars->fTents ^= 1;
            break;
        case 'p':
            pPars->fSwitch ^= 1;
            break;
        case 'c':
            pPars->fCut ^= 1;
            break;
        case 'n':
            pPars->fNpn ^= 1;
            break;
        case 'l':
            pPars->fLutProf ^= 1;
            break;
        case 'm':
            pPars->fMuxXor ^= 1;
            break;
        case 'a':
            pPars->fMiter ^= 1;
            break;
        case 's':
            pPars->fSlacks ^= 1;
            break;
        case 'z':
            pPars->fSkipMap ^= 1;
            break;
        case 'x':
            pPars->fNoColor ^= 1;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pDumpFile = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'b':
            fBest ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( fBest )
    {
        if ( pAbc->pGiaBest == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Ps(): There is no AIG.\n" );
            return 1;
        }
        Gia_ManPrintStats( pAbc->pGiaBest, pPars );
    }
    else
    {
        if ( pAbc->pGia == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Ps(): There is no AIG.\n" );
            return 1;
        }
        Gia_ManPrintStats( pAbc->pGia, pPars );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &ps [-tpcnlmaszxbh] [-D file]\n" );
    Abc_Print( -2, "\t          prints stats of the current AIG\n" );
    Abc_Print( -2, "\t-t      : toggle printing BMC tents [default = %s]\n",                pPars->fTents? "yes": "no" );
    Abc_Print( -2, "\t-p      : toggle printing switching activity [default = %s]\n",       pPars->fSwitch? "yes": "no" );
    Abc_Print( -2, "\t-c      : toggle printing the size of frontier cut [default = %s]\n", pPars->fCut? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle printing NPN classes of functions [default = %s]\n", pPars->fNpn? "yes": "no" );
    Abc_Print( -2, "\t-l      : toggle printing LUT size profile [default = %s]\n",         pPars->fLutProf? "yes": "no" );
    Abc_Print( -2, "\t-m      : toggle printing MUX/XOR statistics [default = %s]\n",       pPars->fMuxXor? "yes": "no" );
    Abc_Print( -2, "\t-a      : toggle printing miter statistics [default = %s]\n",         pPars->fMiter? "yes": "no" );
    Abc_Print( -2, "\t-s      : toggle printing slack distribution [default = %s]\n",       pPars->fSlacks? "yes": "no" );
    Abc_Print( -2, "\t-z      : skip mapping statistics even if mapped [default = %s]\n",   pPars->fSkipMap? "yes": "no" );
    Abc_Print( -2, "\t-n      : toggle using no color in the printout [default = %s]\n",    pPars->fNoColor? "yes": "no" );
    Abc_Print( -2, "\t-x      : toggle printing saved AIG statistics [default = %s]\n",     fBest? "yes": "no" );
    Abc_Print( -2, "\t-D file : file name to dump statistics [default = none]\n" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}